

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatadst.c
# Opt level: O0

boolean empty_output_buffer(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  size_t sVar2;
  long *in_RDI;
  my_dest_ptr dest;
  
  puVar1 = (undefined8 *)in_RDI[5];
  sVar2 = fwrite((void *)puVar1[6],1,0x1000,(FILE *)puVar1[5]);
  if (sVar2 != 0x1000) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  *puVar1 = puVar1[6];
  puVar1[1] = 0x1000;
  return 1;
}

Assistant:

METHODDEF(boolean)
empty_output_buffer(j_compress_ptr cinfo)
{
  my_dest_ptr dest = (my_dest_ptr)cinfo->dest;

  if (JFWRITE(dest->outfile, dest->buffer, OUTPUT_BUF_SIZE) !=
      (size_t)OUTPUT_BUF_SIZE)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  dest->pub.next_output_byte = dest->buffer;
  dest->pub.free_in_buffer = OUTPUT_BUF_SIZE;

  return TRUE;
}